

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_collision_bench.cc
# Opt level: O0

void RandomCommand(char **s)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  int local_18;
  int i;
  int len;
  char **s_local;
  
  lVar2 = random();
  iVar1 = (int)lVar2;
  pcVar3 = (char *)operator_new__((long)(iVar1 + 1));
  *s = pcVar3;
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    lVar2 = random();
    (*s)[local_18] = (char)lVar2;
  }
  (*s)[iVar1] = '\0';
  return;
}

Assistant:

void RandomCommand(char** s) {
  int len = random(5, 100);
  *s = new char[len+1];
  for (int i = 0; i < len; ++i)
    (*s)[i] = (char)random(32, 127);
  (*s)[len] = '\0';
}